

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
::emplace_new_key<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>
          (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*> *key)

{
  char cVar1;
  Symbol *pSVar2;
  Expression *pEVar3;
  EntryPointer psVar4;
  EntryPointer psVar5;
  EntryPointer psVar6;
  sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
  sVar7;
  long lVar8;
  Expression *pEVar9;
  Symbol *pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_bool>
  pVar13;
  pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*> local_28;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
       )distance_from_desired)) {
    pEVar9 = (Expression *)(*(long *)(this + 0x20) + 1);
    auVar11._8_4_ = (int)((ulong)pEVar9 >> 0x20);
    auVar11._0_8_ = pEVar9;
    auVar11._12_4_ = 0x45300000;
    lVar8 = *(long *)(this + 0x10) + 1;
    auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = 0x45300000;
    if ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)pEVar9) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
      cVar1 = current_entry->distance_from_desired;
      if (cVar1 < '\0') {
        pEVar3 = key->second;
        (current_entry->field_1).value.first = key->first;
        (current_entry->field_1).value.second = pEVar3;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pSVar2 = key->first;
        pEVar3 = key->second;
        current_entry->distance_from_desired = distance_from_desired;
        pSVar10 = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = pSVar2;
        pEVar9 = (current_entry->field_1).value.second;
        (current_entry->field_1).value.second = pEVar3;
        sVar7 = (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
                 )(cVar1 + '\x01');
        cVar1 = current_entry[1].distance_from_desired;
        psVar6 = current_entry + 1;
        psVar5 = current_entry;
        while (psVar4 = psVar6, -1 < cVar1) {
          if (cVar1 < (char)sVar7) {
            psVar4->distance_from_desired = (int8_t)sVar7;
            pSVar2 = (psVar4->field_1).value.first;
            pEVar3 = (psVar4->field_1).value.second;
            (psVar4->field_1).value.first = pSVar10;
            (psVar4->field_1).value.second = pEVar9;
            sVar7 = (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
                     )(cVar1 + '\x01');
            pEVar9 = pEVar3;
            pSVar10 = pSVar2;
          }
          else {
            sVar7 = (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
                     )((char)sVar7 + '\x01');
            if (sVar7 == this[0x19]) {
              local_28.first = (current_entry->field_1).value.first;
              (current_entry->field_1).value.first = pSVar10;
              local_28.second = (current_entry->field_1).value.second;
              (current_entry->field_1).value.second = pEVar9;
              key = &local_28;
              goto LAB_0039790b;
            }
          }
          psVar6 = psVar4 + 1;
          psVar5 = psVar4;
          cVar1 = psVar4[1].distance_from_desired;
        }
        psVar5[1].field_1.value.first = pSVar10;
        psVar5[1].field_1.value.second = pEVar9;
        psVar4->distance_from_desired = (int8_t)sVar7;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar13._9_7_ = (int7)((ulong)pEVar9 >> 8);
      pVar13.second = true;
      pVar13.first.current = current_entry;
      return pVar13;
    }
  }
LAB_0039790b:
  sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>
          *)this);
  pVar13 = emplace<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>(this,key);
  return pVar13;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }